

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.c
# Opt level: O0

int nsync::counter_dequeue(void *v,nsync_waiter_s *nw)

{
  uint uVar1;
  uint uVar2;
  nsync_dll_list_ pnVar3;
  int32_t value;
  nsync_counter c;
  nsync_waiter_s *nw_local;
  void *v_local;
  
  nsync_mu_lock((nsync_mu *)((long)v + 8));
  uVar1 = std::atomic_load_explicit<unsigned_int>
                    ((atomic<unsigned_int> *)((long)v + 0x18),memory_order_acquire);
  uVar2 = std::atomic_load_explicit<unsigned_int>(&nw->waiting,memory_order_acquire);
  if (uVar2 != 0) {
    pnVar3 = nsync_dll_remove_(*(nsync_dll_list_ *)((long)v + 0x20),&nw->q);
    *(nsync_dll_list_ *)((long)v + 0x20) = pnVar3;
    std::atomic_store_explicit<unsigned_int>(&nw->waiting,0,memory_order_relaxed);
  }
  nsync_mu_unlock((nsync_mu *)((long)v + 8));
  return (int)(uVar1 != 0);
}

Assistant:

static int counter_dequeue (void *v, struct nsync_waiter_s *nw) {
	nsync_counter c = (nsync_counter) v;
	int32_t value;
	nsync_mu_lock (&c->counter_mu);
	value = ATM_LOAD_ACQ (&c->value);
	if (ATM_LOAD_ACQ (&nw->waiting) != 0) {
		c->waiters = nsync_dll_remove_ (c->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 0);
	}
	nsync_mu_unlock (&c->counter_mu);
	return (value != 0);
}